

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_ManPrepareCuts(Mf_Cut_t *pCuts,Mf_Man_t *p,int iObj,int fAddUnit)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Mf_Obj_t *pMVar4;
  int *piVar5;
  word wVar6;
  int *pList;
  int *pCut;
  Mf_Cut_t *pMStack_30;
  int i;
  Mf_Cut_t *pMfCut;
  int fAddUnit_local;
  int iObj_local;
  Mf_Man_t *p_local;
  Mf_Cut_t *pCuts_local;
  
  pMVar4 = Mf_ManObj(p,iObj);
  if (pMVar4->iCutSet == 0) {
    pCuts_local._4_4_ = Mf_CutCreateUnit(pCuts,iObj);
  }
  else {
    piVar5 = Mf_ObjCutSet(p,iObj);
    pCut._4_4_ = 0;
    pList = piVar5 + 1;
    pMStack_30 = pCuts;
    while (pCut._4_4_ < *piVar5) {
      pMStack_30->Delay = 0;
      pMStack_30->Flow = 0.0;
      uVar1 = Mf_CutFunc(pList);
      *(uint *)&pMStack_30->field_0x10 =
           *(uint *)&pMStack_30->field_0x10 & 0xf8000000 | uVar1 & 0x7ffffff;
      iVar2 = Mf_CutSize(pList);
      *(uint *)&pMStack_30->field_0x10 =
           *(uint *)&pMStack_30->field_0x10 & 0x7ffffff | iVar2 << 0x1b;
      iVar2 = Mf_CutSize(pList);
      wVar6 = Mf_CutGetSign(pList + 1,iVar2);
      pMStack_30->Sign = wVar6;
      iVar2 = Mf_CutSize(pList);
      memcpy(pMStack_30->pLeaves,pList + 1,(long)iVar2 << 2);
      pMStack_30 = pMStack_30 + 1;
      pCut._4_4_ = pCut._4_4_ + 1;
      iVar2 = Mf_CutSize(pList);
      pList = pList + (iVar2 + 1);
    }
    if ((fAddUnit == 0) || (*(uint *)&pCuts->field_0x10 >> 0x1b < 2)) {
      pCuts_local._4_4_ = *piVar5;
    }
    else {
      iVar2 = *piVar5;
      iVar3 = Mf_CutCreateUnit(pMStack_30,iObj);
      pCuts_local._4_4_ = iVar2 + iVar3;
    }
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Mf_ManPrepareCuts( Mf_Cut_t * pCuts, Mf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Mf_ManObj(p, iObj)->iCutSet )
    {
        Mf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Mf_ObjCutSet(p, iObj);
        Mf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Mf_CutFunc( pCut );
            pMfCut->nLeaves = Mf_CutSize( pCut );
            pMfCut->Sign    = Mf_CutGetSign( pCut+1, Mf_CutSize(pCut) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Mf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Mf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Mf_CutCreateUnit( pCuts, iObj );
}